

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5StorageDelete(Fts5Storage *p,i64 iDel,sqlite3_value **apVal)

{
  Fts5Config *pFVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  long lVar5;
  Fts5Config *pFVar6;
  long lVar7;
  sqlite3_stmt *psVar8;
  sqlite3_stmt *pDel;
  Fts5Config *local_58;
  sqlite3_stmt *pSeek;
  sqlite_int64 local_48;
  Fts5Storage *local_40;
  undefined4 local_38;
  int local_34;
  
  pFVar6 = p->pConfig;
  pDel = (sqlite3_stmt *)0x0;
  iVar2 = fts5StorageLoadTotals(p,1);
  if (iVar2 == 0) {
    pFVar1 = p->pConfig;
    pSeek = (sqlite3_stmt *)0x0;
    if (apVal == (sqlite3_value **)0x0) {
      iVar2 = fts5StorageGetStmt(p,2,&pSeek,(char **)0x0);
      psVar8 = pSeek;
      if (iVar2 != 0) goto LAB_001a8f6b;
      sqlite3_bind_int64(pSeek,1,iDel);
      iVar2 = sqlite3_step(psVar8);
      if (iVar2 == 100) goto LAB_001a8e26;
      iVar2 = sqlite3_reset(psVar8);
    }
    else {
      psVar8 = (sqlite3_stmt *)0x0;
LAB_001a8e26:
      local_38 = 0xffffffff;
      local_58 = pFVar6;
      local_48 = iDel;
      local_40 = p;
      iVar3 = sqlite3Fts5IndexBeginWrite(p->pIndex,1,iDel);
      for (lVar7 = 1; (iVar3 == 0 && (lVar7 <= pFVar1->nCol)); lVar7 = lVar7 + 1) {
        iVar3 = 0;
        if (pFVar1->abUnindexed[lVar7 + -1] == '\0') {
          if (psVar8 == (sqlite3_stmt *)0x0) {
            puVar4 = sqlite3_value_text(apVal[lVar7 + -1]);
            iVar2 = sqlite3_value_bytes(apVal[lVar7 + -1]);
          }
          else {
            puVar4 = sqlite3_column_text(psVar8,(int)lVar7);
            iVar2 = sqlite3_column_bytes(psVar8,(int)lVar7);
          }
          local_34 = 0;
          if (puVar4 == (uchar *)0x0) {
            lVar5 = 0;
            iVar3 = 0;
          }
          else {
            iVar3 = (*pFVar1->pTokApi->xTokenize)
                              (pFVar1->pTok,&local_40,4,(char *)puVar4,iVar2,
                               fts5StorageInsertCallback);
            lVar5 = (long)local_34;
          }
          p->aTotalSize[lVar7 + -1] = p->aTotalSize[lVar7 + -1] - lVar5;
        }
      }
      p->nTotalRow = p->nTotalRow + -1;
      iVar2 = sqlite3_reset(psVar8);
      pFVar6 = local_58;
      iDel = local_48;
      if (iVar3 != 0) {
        iVar2 = iVar3;
      }
    }
    if (iVar2 == 0) {
      if (pFVar6->bColumnsize == 0) {
        if (pFVar6->eContent != 0) {
          return 0;
        }
        goto LAB_001a8f72;
      }
      iVar2 = fts5StorageGetStmt(p,7,&pDel,(char **)0x0);
      psVar8 = pDel;
      if (iVar2 == 0) {
        sqlite3_bind_int64(pDel,1,iDel);
        sqlite3_step(psVar8);
        iVar2 = sqlite3_reset(psVar8);
      }
    }
  }
LAB_001a8f6b:
  if (pFVar6->eContent != 0 || iVar2 != 0) {
    return iVar2;
  }
LAB_001a8f72:
  iVar2 = fts5StorageGetStmt(p,5,&pDel,(char **)0x0);
  psVar8 = pDel;
  if (iVar2 == 0) {
    sqlite3_bind_int64(pDel,1,iDel);
    sqlite3_step(psVar8);
    iVar2 = sqlite3_reset(psVar8);
  }
  return iVar2;
}

Assistant:

static int sqlite3Fts5StorageDelete(Fts5Storage *p, i64 iDel, sqlite3_value **apVal){
  Fts5Config *pConfig = p->pConfig;
  int rc;
  sqlite3_stmt *pDel = 0;

  assert( pConfig->eContent!=FTS5_CONTENT_NORMAL || apVal==0 );
  rc = fts5StorageLoadTotals(p, 1);

  /* Delete the index records */
  if( rc==SQLITE_OK ){
    rc = fts5StorageDeleteFromIndex(p, iDel, apVal);
  }

  /* Delete the %_docsize record */
  if( rc==SQLITE_OK && pConfig->bColumnsize ){
    rc = fts5StorageGetStmt(p, FTS5_STMT_DELETE_DOCSIZE, &pDel, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDel, 1, iDel);
      sqlite3_step(pDel);
      rc = sqlite3_reset(pDel);
    }
  }

  /* Delete the %_content record */
  if( pConfig->eContent==FTS5_CONTENT_NORMAL ){
    if( rc==SQLITE_OK ){
      rc = fts5StorageGetStmt(p, FTS5_STMT_DELETE_CONTENT, &pDel, 0);
    }
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDel, 1, iDel);
      sqlite3_step(pDel);
      rc = sqlite3_reset(pDel);
    }
  }

  return rc;
}